

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Nullability nullability_00;
  ulong uVar2;
  HeapType HVar3;
  Iterator IVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  Type local_c0;
  Type subType;
  Nullability nullability;
  HeapType heapType;
  value_type local_80;
  uintptr_t *local_78;
  Type *t;
  Iterator __end2;
  undefined1 local_50 [8];
  Iterator __begin2;
  Type *__range2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  this_local = (TranslateToFuzzReader *)type.id;
  uVar2 = ::wasm::Type::isTuple();
  if ((uVar2 & 1) == 0) {
    uVar2 = ::wasm::Type::isRef();
    if ((uVar2 & 1) == 0) {
      bVar1 = Type::isBasic((Type *)&this_local);
      if (!bVar1) {
        __assert_fail("type.isBasic()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xdbf,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
      }
      type_local.id = (uintptr_t)this_local;
    }
    else {
      HVar3.id = ::wasm::Type::getHeapType();
      HVar3 = getSubType(this,HVar3);
      nullability_00 = ::wasm::Type::getNullability();
      subType.id._4_4_ = getSubType(this,nullability_00);
      ::wasm::Type::Type(&local_c0,HVar3,subType.id._4_4_);
      bVar1 = isUninhabitable(local_c0);
      if (((!bVar1) || (bVar1 = isUninhabitable((Type)this_local), bVar1)) ||
         (bVar1 = oneIn(this,0x14), bVar1)) {
        type_local.id = local_c0.id;
      }
      else {
        type_local.id = (uintptr_t)this_local;
      }
    }
  }
  else {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)&this_local;
    IVar4 = Type::begin((Type *)__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index);
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    local_50 = (undefined1  [8])
               IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            Type::end((Type *)__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index);
    while( true ) {
      __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar5.index;
      t = PVar5.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_50,
                         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
      if (!bVar1) break;
      local_78 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_50);
      local_80.id = (uintptr_t)getSubType(this,*local_78);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2,&local_80);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_50);
      PVar5.index = (size_t)__end2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar5.parent = t;
    }
    Tuple::Tuple((Tuple *)&heapType,(TypeList *)&__range2);
    ::wasm::Type::Type(&type_local,(Tuple *)&heapType);
    Tuple::~Tuple((Tuple *)&heapType);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
  }
  return (Type)type_local.id;
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = getSubType(type.getHeapType());
    auto nullability = getSubType(type.getNullability());
    auto subType = Type(heapType, nullability);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (isUninhabitable(subType) && !isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}